

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.cpp
# Opt level: O0

unique_ptr<pstore::region::factory,_std::default_delete<pstore::region::factory>_> __thiscall
pstore::region::get_factory
          (region *this,shared_ptr<pstore::file::in_memory> *file,uint64_t full_size,
          uint64_t min_size)

{
  shared_ptr<pstore::file::in_memory> local_30;
  uint64_t min_size_local;
  uint64_t full_size_local;
  shared_ptr<pstore::file::in_memory> *file_local;
  
  local_30.super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)min_size;
  min_size_local = full_size;
  full_size_local = (uint64_t)file;
  file_local = (shared_ptr<pstore::file::in_memory> *)this;
  std::
  make_unique<pstore::region::mem_based_factory,std::shared_ptr<pstore::file::in_memory>const&,unsigned_long&,unsigned_long&>
            (&local_30,(unsigned_long *)file,&min_size_local);
  std::unique_ptr<pstore::region::factory,std::default_delete<pstore::region::factory>>::
  unique_ptr<pstore::region::mem_based_factory,std::default_delete<pstore::region::mem_based_factory>,void>
            ((unique_ptr<pstore::region::factory,std::default_delete<pstore::region::factory>> *)
             this,(unique_ptr<pstore::region::mem_based_factory,_std::default_delete<pstore::region::mem_based_factory>_>
                   *)&local_30);
  std::
  unique_ptr<pstore::region::mem_based_factory,_std::default_delete<pstore::region::mem_based_factory>_>
  ::~unique_ptr((unique_ptr<pstore::region::mem_based_factory,_std::default_delete<pstore::region::mem_based_factory>_>
                 *)&local_30);
  return (__uniq_ptr_data<pstore::region::factory,_std::default_delete<pstore::region::factory>,_true,_true>
          )(__uniq_ptr_data<pstore::region::factory,_std::default_delete<pstore::region::factory>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<factory> get_factory (std::shared_ptr<file::in_memory> const & file,
                                              std::uint64_t full_size, std::uint64_t min_size) {
            return std::make_unique<mem_based_factory> (file, full_size, min_size);
        }